

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::build(TranslateToFuzzReader *this)

{
  Module *module;
  Name root;
  string_view sVar1;
  
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    module = this->wasm;
    root.super_IString.str = (IString)wasm::IString::interned(9,"hangLimit",0);
    sVar1 = (string_view)Names::getValidGlobalName(module,root);
    (this->HANG_LIMIT_GLOBAL).super_IString.str = sVar1;
  }
  if (this->allowMemory == true) {
    setupMemory(this);
  }
  setupHeapTypes(this);
  setupTables(this);
  setupGlobals(this);
  if (((byte)this->wasm[0x178] & 0x40) != 0) {
    setupTags(this);
    addImportThrowingSupport(this);
  }
  if (((byte)this->wasm[0x179] & 1) != 0) {
    addImportTableSupport(this);
  }
  addImportLoggingSupport(this);
  addImportCallingSupport(this);
  addImportSleepSupport(this);
  modifyInitialFunctions(this);
  processFunctions(this);
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    addHangLimitSupport(this);
  }
  if (this->allowMemory == true) {
    finalizeMemory(this);
    addHashMemorySupport(this);
  }
  finalizeTable(this);
  shuffleExports(this);
  return;
}

Assistant:

void TranslateToFuzzReader::build() {
  if (fuzzParams->HANG_LIMIT > 0) {
    prepareHangLimitSupport();
  }
  if (allowMemory) {
    setupMemory();
  }
  setupHeapTypes();
  setupTables();
  setupGlobals();
  if (wasm.features.hasExceptionHandling()) {
    setupTags();
    addImportThrowingSupport();
  }
  if (wasm.features.hasReferenceTypes()) {
    addImportTableSupport();
  }
  addImportLoggingSupport();
  addImportCallingSupport();
  addImportSleepSupport();
  modifyInitialFunctions();
  processFunctions();
  if (fuzzParams->HANG_LIMIT > 0) {
    addHangLimitSupport();
  }
  if (allowMemory) {
    finalizeMemory();
    addHashMemorySupport();
  }
  finalizeTable();
  shuffleExports();
}